

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O2

void __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::AllocCounters<unsigned_int>
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          FunctionBody *host)

{
  Type TVar1;
  Fields *pFVar2;
  code *pcVar3;
  bool bVar4;
  ThreadContext *pTVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  Fields *ptr;
  long lVar8;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pTVar5 = ThreadContext::GetContextForCurrentThread();
  if (pTVar5 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x98,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar4) goto LAB_006df7d6;
    *puVar6 = 0;
  }
  pRVar7 = ((host->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if (pRVar7 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x99,"(host->GetRecycler() != nullptr)",
                                "host->GetRecycler() != nullptr");
    if (!bVar4) goto LAB_006df7d6;
    *puVar6 = 0;
    pRVar7 = ((host->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  }
  local_50 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0x6c;
  data.count = (size_t)anon_var_dwarf_2a0e4cd;
  data.filename._0_4_ = 0x9d;
  pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,(TrackAllocData *)local_50);
  ptr = (Fields *)new__<Memory::Recycler>(0x1b0,pRVar7,0x59dc42);
  TVar1 = this->fieldSize;
  if (TVar1 != '\0') {
    pFVar2 = (host->counters).fields.ptr;
    if (TVar1 == '\x01') {
      for (lVar8 = 0; lVar8 != 0x1b; lVar8 = lVar8 + 1) {
        *(uint *)(ptr + lVar8 * 4) = (uint)(byte)pFVar2[lVar8];
      }
    }
    else if (TVar1 == '\x02') {
      for (lVar8 = 0; lVar8 != 0x1b; lVar8 = lVar8 + 1) {
        *(uint *)(ptr + lVar8 * 4) = (uint)*(ushort *)(pFVar2 + lVar8 * 2);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                  ,0xba,"(this->fieldSize==0)","this->fieldSize==0");
      if (!bVar4) {
LAB_006df7d6:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    if (this->fieldSize != '\0') {
      local_50 = (undefined1  [8])
                 &((host->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                  threadContext->csFunctionBody;
      CCLock::Enter((CCLock *)local_50);
      this->fieldSize = '\x04';
      Memory::
      WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
      ::WriteBarrierSet(&this->fields,ptr);
      AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)local_50);
      return;
    }
  }
  this->fieldSize = '\x04';
  Memory::
  WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>::
  WriteBarrierSet(&this->fields,ptr);
  return;
}

Assistant:

void AllocCounters(T* host)
        {
            // only allow expanding in foreground thread. while function body cleanup 
            // we may set counters to 0 but that would not lead to expanding
            Assert(ThreadContext::GetContextForCurrentThread());
            Assert(host->GetRecycler() != nullptr);

            const uint8 max = static_cast<uint8>(CountT::Max);
            typedef CompactCounters<T, CountT> CounterT;
            CounterT::Fields* fieldsArray = (CounterT::Fields*)RecyclerNewArrayLeafZ(host->GetRecycler(), FieldT, sizeof(FieldT)*max);
            CounterT::Fields* oldFieldsArray = host->counters.fields;
            uint8 i = 0;
            if (this->fieldSize == 1)
            {
                if (sizeof(FieldT) == 2)
                {
                    for (; i < max; i++)
                    {
                        fieldsArray->u16Fields[i] = oldFieldsArray->u8Fields[i];
                    }
                }
                else if (sizeof(FieldT) == 4)
                {
                    for (; i < max; i++)
                    {
                        fieldsArray->u32Fields[i] = oldFieldsArray->u8Fields[i];
                    }
                }
            }
            else if (this->fieldSize == 2)
            {
                for (; i < max; i++)
                {
                    fieldsArray->u32Fields[i] = oldFieldsArray->u16Fields[i];
                }
            }
            else
            {
                Assert(this->fieldSize==0);
            }

            if (this->fieldSize == 0)
            {
                this->fieldSize = sizeof(FieldT);
                this->fields = fieldsArray;
            }
            else
            {
                AutoCriticalSection autoCS(host->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
                this->fieldSize = sizeof(FieldT);
                this->fields = fieldsArray;
            }
        }